

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

size_t __thiscall proto2_unittest::PackedInt32::ByteSizeLong(PackedInt32 *this)

{
  ulong uVar1;
  size_t sVar2;
  
  sVar2 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_int32_,3,
                     &(this->field_0)._impl_._repeated_int32_cached_byte_size_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar2 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar2;
  }
  return sVar2;
}

Assistant:

::size_t PackedInt32::ByteSizeLong() const {
  const PackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.PackedInt32)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 2048 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32(), 3,
              this_._impl_._repeated_int32_cached_byte_size_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}